

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qminimalintegration.cpp
# Opt level: O3

QPlatformFontDatabase * __thiscall QMinimalIntegration::fontDatabase(QMinimalIntegration *this)

{
  QPlatformFontDatabase *pQVar1;
  undefined *puVar2;
  
  if (this->m_fontDatabase != (QPlatformFontDatabase *)0x0) {
    return this->m_fontDatabase;
  }
  if ((this->m_options & 2) == 0) {
    puVar2 = &DummyFontDatabase::vtable;
  }
  else {
    puVar2 = &QFontconfigDatabase::vtable;
  }
  pQVar1 = (QPlatformFontDatabase *)operator_new(8);
  *(undefined **)pQVar1 = puVar2 + 0x10;
  this->m_fontDatabase = pQVar1;
  return pQVar1;
}

Assistant:

QPlatformFontDatabase *QMinimalIntegration::fontDatabase() const
{
    if (!m_fontDatabase && (m_options & EnableFonts)) {
#if defined(Q_OS_WIN)
        if (m_options & FreeTypeFontDatabase) {
#  if QT_CONFIG(freetype)
            m_fontDatabase = new QWindowsFontDatabaseFT;
#  endif // freetype
        } else {
            m_fontDatabase = new QWindowsFontDatabase;
        }
#elif defined(Q_OS_DARWIN)
        if (!(m_options & FontconfigDatabase)) {
            if (m_options & FreeTypeFontDatabase) {
#  if QT_CONFIG(freetype)
                m_fontDatabase = new QCoreTextFontDatabaseEngineFactory<QFontEngineFT>;
#  endif // freetype
            } else {
                m_fontDatabase = new QCoreTextFontDatabaseEngineFactory<QCoreTextFontEngine>;
            }
        }
#endif

        if (!m_fontDatabase) {
#if QT_CONFIG(fontconfig)
            m_fontDatabase = new QGenericUnixFontDatabase;
#else
            m_fontDatabase = QPlatformIntegration::fontDatabase();
#endif
        }
    }
    if (!m_fontDatabase)
        m_fontDatabase = new DummyFontDatabase;
    return m_fontDatabase;
}